

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

LoadedFile * lf_load_keyfile_fp(FILE *fp,char **errptr)

{
  _Bool _Var1;
  LoadFileStatus status;
  LoadedFile *lf;
  char **errptr_local;
  FILE *fp_local;
  
  fp_local = (FILE *)lf_new(0x56555);
  status = lf_load_fp((LoadedFile *)fp_local,fp);
  _Var1 = lf_load_keyfile_helper(status,errptr);
  if (!_Var1) {
    lf_free((LoadedFile *)fp_local);
    fp_local = (FILE *)0x0;
  }
  return (LoadedFile *)fp_local;
}

Assistant:

LoadedFile *lf_load_keyfile_fp(FILE *fp, const char **errptr)
{
    LoadedFile *lf = lf_new(MAX_KEY_FILE_SIZE);
    if (!lf_load_keyfile_helper(lf_load_fp(lf, fp), errptr)) {
        lf_free(lf);
        return NULL;
    }
    return lf;
}